

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O1

void __thiscall HFactor::updateCFT(HFactor *this,HVector *aq,HVector *ep,HighsInt *iRow)

{
  HVectorBase<double> **ppHVar1;
  double *__args;
  double dVar2;
  int iVar3;
  pointer pdVar4;
  iterator iVar5;
  iterator iVar6;
  pointer piVar7;
  pointer piVar8;
  pointer piVar9;
  pointer piVar10;
  pointer piVar11;
  bool bVar12;
  HVectorBase<double> *pHVar13;
  void *pvVar14;
  void *pvVar15;
  void *pvVar16;
  undefined4 *puVar17;
  pointer piVar18;
  ulong uVar19;
  pointer piVar20;
  int iVar21;
  long lVar22;
  size_t sVar23;
  uint uVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  int iVar28;
  void *pvVar29;
  int *piVar30;
  long lVar31;
  HighsInt *pHVar32;
  size_type __new_size;
  int iVar33;
  long lVar34;
  HighsInt index;
  HighsInt index_1;
  HighsInt u_endX;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> sorted_pp;
  pair<int,_int> local_140;
  ulong local_138;
  int local_12c;
  double local_128;
  undefined8 uStack_120;
  vector<int,std::allocator<int>> *local_118;
  int local_10c;
  double local_108;
  undefined8 uStack_100;
  vector<double,std::allocator<double>> *local_f0;
  void *local_e8;
  void *local_e0;
  undefined4 *local_d8;
  void *local_d0;
  vector<int,std::allocator<int>> *local_c8;
  vector<int,_std::allocator<int>_> *local_c0;
  HighsInt *local_b8;
  void *local_b0;
  vector<int,std::allocator<int>> *local_a8;
  vector<int,std::allocator<int>> *local_a0;
  void *local_98;
  vector<int,std::allocator<int>> *local_90;
  vector<int,std::allocator<int>> *local_88;
  void *local_80;
  ulong local_78;
  vector<int,std::allocator<int>> *local_70;
  vector<int,std::allocator<int>> *local_68;
  int local_5c;
  pair<int,_int> *local_58;
  iterator iStack_50;
  pair<int,_int> *local_48;
  vector<double,std::allocator<double>> *local_38;
  
  uVar24 = 0;
  pHVar13 = aq;
  if (aq != (HVector *)0x0) {
    do {
      uVar24 = uVar24 + 1;
      ppHVar1 = &pHVar13->next;
      pHVar13 = *ppHVar1;
    } while (*ppHVar1 != (HVectorBase<double> *)0x0);
  }
  uVar27 = (ulong)uVar24;
  dVar2 = (double)(uVar27 * 8);
  local_b8 = iRow;
  local_98 = operator_new__((ulong)dVar2);
  local_128 = dVar2;
  local_b0 = operator_new__((ulong)dVar2);
  pvVar29 = local_98;
  if (uVar24 != 0) {
    uVar19 = 0;
    do {
      *(HVector **)((long)local_98 + uVar19 * 8) = aq;
      *(HVector **)((long)local_b0 + uVar19 * 8) = ep;
      aq = aq->next;
      ep = ep->next;
      uVar19 = uVar19 + 1;
    } while (uVar27 != uVar19);
  }
  local_108 = (double)((long)(this->pf_pivot_index).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->pf_pivot_index).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
  pvVar14 = operator_new__(uVar27 * 4);
  dVar2 = local_128;
  pvVar15 = operator_new__((ulong)local_128);
  pvVar16 = operator_new__((ulong)dVar2);
  pHVar32 = local_b8;
  if (uVar27 != 0) {
    piVar18 = (this->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar4 = (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar19 = 0;
    do {
      iVar21 = local_b8[uVar19];
      iVar33 = piVar18[iVar21];
      *(int *)((long)pvVar14 + uVar19 * 4) = iVar33;
      *(double *)((long)pvVar15 + uVar19 * 8) = pdVar4[iVar33];
      *(undefined8 *)((long)pvVar16 + uVar19 * 8) =
           *(undefined8 *)
            (*(long *)(*(long *)((long)pvVar29 + uVar19 * 8) + 0x20) + (long)iVar21 * 8);
      uVar19 = uVar19 + 1;
    } while (uVar27 != uVar19);
  }
  local_e8 = pvVar15;
  local_d0 = pvVar14;
  puVar17 = (undefined4 *)operator_new__(uVar27 * 4 + 4);
  local_e0 = operator_new__((ulong)local_128);
  *puVar17 = (int)((ulong)((long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2);
  local_58 = (pair<int,_int> *)0x0;
  iStack_50._M_current = (pair<int,_int> *)0x0;
  local_48 = (pair<int,_int> *)0x0;
  local_d8 = puVar17;
  local_78 = uVar27;
  if (uVar27 != 0) {
    local_a0 = (vector<int,std::allocator<int>> *)&this->pf_pivot_index;
    local_c8 = (vector<int,std::allocator<int>> *)&this->u_index;
    local_118 = (vector<int,std::allocator<int>> *)&this->iwork;
    local_f0 = (vector<double,std::allocator<double>> *)&this->u_value;
    local_68 = (vector<int,std::allocator<int>> *)&this->pf_index;
    local_70 = (vector<int,std::allocator<int>> *)&this->pf_value;
    local_a8 = (vector<int,std::allocator<int>> *)&this->pf_start;
    local_c0 = (vector<int,_std::allocator<int>_> *)(long)(int)((ulong)local_108 >> 2);
    local_138 = 0;
    local_80 = pvVar16;
    do {
      piVar18 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar18) {
        (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = piVar18;
      }
      lVar22 = *(long *)((long)pvVar29 + local_138 * 8);
      if (0 < *(int *)(lVar22 + 0x7c)) {
        lVar26 = 0;
        do {
          iVar21 = *(int *)(*(long *)(lVar22 + 0x80) + lVar26 * 4);
          local_140.first = iVar21;
          local_128 = *(double *)(*(long *)(lVar22 + 0x98) + lVar26 * 8);
          iVar5._M_current =
               (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_118,iVar5,&local_140.first);
          }
          else {
            *iVar5._M_current = iVar21;
            (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[local_140.first] = local_128;
          lVar26 = lVar26 + 1;
          lVar22 = *(long *)((long)pvVar29 + local_138 * 8);
        } while (lVar26 < *(int *)(lVar22 + 0x7c));
      }
      if (local_138 != 0) {
        uVar27 = 0;
        do {
          iVar21 = pHVar32[uVar27];
          local_140.first = iVar21;
          pdVar4 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_128 = pdVar4[iVar21];
          piVar18 = (this->pf_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar33 = piVar18[uVar27 + (long)local_c0];
          lVar22 = (long)iVar33;
          iVar25 = piVar18[uVar27 + (long)local_c0 + 1];
          if (iVar33 < iVar25) {
            do {
              local_128 = local_128 -
                          pdVar4[(this->pf_index).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar22]] *
                          (this->pf_value).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar22];
              lVar22 = lVar22 + 1;
            } while (iVar25 != lVar22);
          }
          iVar5._M_current =
               (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_118,iVar5,&local_140.first);
          }
          else {
            *iVar5._M_current = iVar21;
            (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[local_140.first] = local_128;
          uVar27 = uVar27 + 1;
        } while (uVar27 != local_138);
      }
      pdVar4 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_88 = (vector<int,std::allocator<int>> *)pdVar4[pHVar32[local_138]];
      pdVar4[pHVar32[local_138]] = 0.0;
      iVar21 = local_d8[local_138];
      lVar22 = (long)iVar21;
      piVar18 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar20 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (piVar20 != piVar18) {
        uVar27 = 0;
        uVar19 = 1;
        do {
          local_12c = piVar18[uVar27];
          pdVar4 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_140 = *(pair<int,_int> *)(pdVar4 + local_12c);
          pdVar4[local_12c] = 0.0;
          if (1e-14 < ABS((double)local_140)) {
            iVar5._M_current =
                 (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_c8,iVar5,&local_12c);
            }
            else {
              *iVar5._M_current = local_12c;
              (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar5._M_current + 1;
            }
            iVar6._M_current =
                 (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar6._M_current ==
                (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        (local_f0,iVar6,(double *)&local_140);
            }
            else {
              *iVar6._M_current = (double)local_140;
              (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar6._M_current + 1;
            }
          }
          piVar18 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar20 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          bVar12 = uVar19 < (ulong)((long)piVar20 - (long)piVar18 >> 2);
          uVar27 = uVar19;
          uVar19 = (ulong)((int)uVar19 + 1);
        } while (bVar12);
      }
      pvVar16 = local_b0;
      local_90 = (vector<int,std::allocator<int>> *)
                 ((ulong)((long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_start) >> 2);
      local_d8[local_138 + 1] = (int)local_90;
      *(double *)((long)local_e0 + local_138 * 8) =
           *(double *)((long)local_e8 + local_138 * 8) * *(double *)((long)local_80 + local_138 * 8)
      ;
      if (piVar20 != piVar18) {
        (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = piVar18;
      }
      lVar26 = *(long *)((long)local_b0 + local_138 * 8);
      if (0 < *(int *)(lVar26 + 0x7c)) {
        lVar34 = 0;
        do {
          iVar33 = *(int *)(*(long *)(lVar26 + 0x80) + lVar34 * 4);
          local_140.first = iVar33;
          local_128 = *(double *)(*(long *)(lVar26 + 0x98) + lVar34 * 8);
          iVar5._M_current =
               (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_118,iVar5,&local_140.first);
          }
          else {
            *iVar5._M_current = iVar33;
            (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[local_140.first] = local_128;
          lVar34 = lVar34 + 1;
          lVar26 = *(long *)((long)pvVar16 + local_138 * 8);
        } while (lVar34 < *(int *)(lVar26 + 0x7c));
      }
      if (local_138 != 0) {
        uVar27 = 0;
        do {
          lVar26 = (long)local_58[uVar27].second;
          iVar33 = pHVar32[lVar26];
          local_108 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar33];
          uStack_100 = 0;
          if ((1e-14 < ABS(local_108)) &&
             (lVar34 = *(long *)((long)local_b0 + lVar26 * 8), 0 < *(int *)(lVar34 + 0x7c))) {
            local_108 = local_108 * -*(double *)((long)local_e8 + lVar26 * 8);
            uStack_100 = 0;
            lVar31 = 0;
            do {
              iVar25 = *(int *)(*(long *)(lVar34 + 0x80) + lVar31 * 4);
              local_140.first = iVar25;
              local_128 = *(double *)(*(long *)(lVar34 + 0x98) + lVar31 * 8);
              iVar5._M_current =
                   (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar5._M_current ==
                  (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (local_118,iVar5,&local_140.first);
              }
              else {
                *iVar5._M_current = iVar25;
                (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar5._M_current + 1;
              }
              pdVar4 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar4[local_140.first] = local_128 * local_108 + pdVar4[local_140.first];
              lVar31 = lVar31 + 1;
              lVar34 = *(long *)((long)local_b0 + lVar26 * 8);
            } while (lVar31 < *(int *)(lVar34 + 0x7c));
          }
          pvVar29 = local_98;
          pHVar32 = local_b8;
          (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar33] = 0.0;
          uVar27 = uVar27 + 1;
        } while (uVar27 != local_138);
        uVar27 = 0;
        do {
          iVar33 = pHVar32[uVar27];
          local_140.first = iVar33;
          pdVar4 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_128 = pdVar4[iVar33];
          lVar26 = (long)(int)local_d8[uVar27];
          if ((int)local_d8[uVar27] < (int)local_d8[uVar27 + 1]) {
            do {
              local_128 = local_128 -
                          pdVar4[(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar26]] *
                          (this->u_value).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar26];
              lVar26 = lVar26 + 1;
            } while ((int)local_d8[uVar27 + 1] != lVar26);
          }
          local_108 = *(double *)((long)local_e0 + uVar27 * 8);
          iVar5._M_current =
               (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_118,iVar5,&local_140.first);
          }
          else {
            *iVar5._M_current = iVar33;
            (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          uVar27 = uVar27 + 1;
          (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[local_140.first] = local_128 / local_108;
        } while (uVar27 != local_138);
      }
      dVar2 = 0.0;
      if (iVar21 < (int)local_90) {
        dVar2 = 0.0;
        do {
          dVar2 = dVar2 + (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start
                          [(this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar22]] *
                          (this->u_value).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar22];
          lVar22 = lVar22 + 1;
        } while ((int)local_90 != lVar22);
      }
      piVar30 = pHVar32 + local_138;
      *(double *)((long)local_e0 + local_138 * 8) =
           dVar2 * *(double *)((long)local_e8 + local_138 * 8) + (double)local_88;
      (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[*piVar30] = 0.0;
      piVar18 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar18) {
        local_108 = -*(double *)((long)local_e8 + local_138 * 8);
        uStack_100 = 0x8000000000000000;
        uVar27 = 0;
        uVar19 = 1;
        do {
          local_12c = piVar18[uVar27];
          pdVar4 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_128 = pdVar4[local_12c];
          pdVar4[local_12c] = 0.0;
          uStack_120 = 0;
          if (1e-14 < ABS(local_128)) {
            iVar5._M_current =
                 (this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_68,iVar5,&local_12c);
            }
            else {
              *iVar5._M_current = local_12c;
              (this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar5._M_current + 1;
            }
            local_140 = (pair<int,_int>)(local_128 * local_108);
            iVar6._M_current =
                 (this->pf_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar6._M_current ==
                (this->pf_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                        ((vector<double,_std::allocator<double>_> *)local_70,iVar6,
                         (double *)&local_140);
            }
            else {
              *iVar6._M_current = (double)local_140;
              (this->pf_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar6._M_current + 1;
            }
          }
          piVar18 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          bVar12 = uVar19 < (ulong)((long)(this->iwork).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish - (long)piVar18 >> 2);
          uVar27 = uVar19;
          uVar19 = (ulong)((int)uVar19 + 1);
        } while (bVar12);
      }
      iVar5._M_current =
           (this->pf_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->pf_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(local_a0,iVar5,piVar30);
      }
      else {
        *iVar5._M_current = *piVar30;
        (this->pf_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      pvVar16 = local_d0;
      iVar5._M_current =
           (this->pf_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      iVar21 = (int)((ulong)((long)(this->pf_index).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->pf_index).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
      this->u_total_x = (this->u_total_x - iVar5._M_current[-1]) + iVar21;
      local_140.first = iVar21;
      if (iVar5._M_current ==
          (this->pf_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)local_a8,iVar5,&local_140.first);
      }
      else {
        *iVar5._M_current = iVar21;
        (this->pf_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      local_140 = (pair<int,_int>)
                  (local_138 << 0x20 | (ulong)*(uint *)((long)pvVar16 + local_138 * 4));
      if (iStack_50._M_current == local_48) {
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_realloc_insert<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                   iStack_50,&local_140);
      }
      else {
        *iStack_50._M_current = local_140;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
      if (local_58 != iStack_50._M_current) {
        uVar27 = (long)iStack_50._M_current - (long)local_58 >> 3;
        iVar21 = 0;
        if (1 < uVar27) {
          iVar21 = 0;
          do {
            uVar27 = (long)uVar27 >> 1;
            iVar21 = iVar21 + 1;
          } while (1 < uVar27);
        }
        pdqsort_detail::
        pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>,false>
                  (local_58,iStack_50._M_current,iVar21,1);
      }
      local_138 = local_138 + 1;
    } while (local_138 != local_78);
    local_90 = (vector<int,std::allocator<int>> *)&this->ur_lastp;
    local_88 = (vector<int,std::allocator<int>> *)&this->ur_start;
    local_70 = (vector<int,std::allocator<int>> *)&this->u_last_p;
    local_68 = (vector<int,std::allocator<int>> *)&this->u_start;
    local_c0 = &this->ur_index;
    local_c8 = (vector<int,std::allocator<int>> *)&this->ur_value;
    local_a0 = (vector<int,std::allocator<int>> *)&this->ur_space;
    local_a8 = (vector<int,std::allocator<int>> *)&this->u_pivot_index;
    local_38 = (vector<double,std::allocator<double>> *)&this->u_pivot_value;
    uVar27 = 0;
    do {
      iVar21 = pHVar32[uVar27];
      local_140.first = iVar21;
      local_128 = (double)(long)*(int *)((long)local_d0 + uVar27 * 4);
      piVar18 = (this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar20 = (this->ur_lastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      this->u_total_x = this->u_total_x + (piVar18[(long)local_128] - piVar20[(long)local_128]);
      lVar22 = (long)piVar18[(long)local_128];
      if (piVar18[(long)local_128] < piVar20[(long)local_128]) {
        piVar7 = (this->ur_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (this->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar9 = (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar10 = (this->u_last_p).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar11 = (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar4 = (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar33 = piVar8[piVar7[lVar22]];
          iVar25 = piVar9[iVar33];
          iVar3 = piVar10[iVar33];
          piVar10[iVar33] = iVar3 + -1;
          iVar33 = iVar25;
          if (iVar25 < iVar3) {
            piVar30 = piVar11 + iVar25;
            do {
              iVar33 = iVar25;
              if (*piVar30 == iVar21) break;
              iVar25 = iVar25 + 1;
              piVar30 = piVar30 + 1;
              iVar33 = iVar3;
            } while (iVar3 != iVar25);
          }
          piVar11[iVar33] = piVar11[(long)iVar3 + -1];
          pdVar4[iVar33] = pdVar4[(long)iVar3 + -1];
          lVar22 = lVar22 + 1;
        } while (lVar22 < piVar20[(long)local_128]);
      }
      piVar7 = (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar8 = (this->u_last_p).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      this->u_total_x = this->u_total_x + (piVar7[(long)local_128] - piVar8[(long)local_128]);
      iVar33 = piVar7[(long)local_128];
      lVar22 = (long)iVar33;
      if (iVar33 < piVar8[(long)local_128]) {
        piVar7 = (this->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar9 = (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar10 = (this->ur_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar11 = (this->ur_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar4 = (this->ur_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar33 = piVar7[piVar9[lVar22]];
          iVar25 = piVar18[iVar33];
          iVar3 = piVar20[iVar33];
          piVar20[iVar33] = iVar3 + -1;
          iVar28 = iVar25;
          if (iVar25 < iVar3) {
            piVar30 = piVar10 + iVar25;
            do {
              iVar28 = iVar25;
              if (*piVar30 == iVar21) break;
              iVar25 = iVar25 + 1;
              piVar30 = piVar30 + 1;
              iVar28 = iVar3;
            } while (iVar3 != iVar25);
          }
          piVar30 = piVar11 + iVar33;
          *piVar30 = *piVar30 + 1;
          piVar10[iVar28] = piVar10[(long)iVar3 + -1];
          pdVar4[iVar28] = pdVar4[(long)iVar3 + -1];
          lVar22 = lVar22 + 1;
        } while (lVar22 < piVar8[(long)local_128]);
      }
      local_12c = local_d8[uVar27];
      lVar22 = (long)local_12c;
      local_10c = local_d8[uVar27 + 1];
      this->u_total_x = this->u_total_x + (local_10c - local_12c);
      local_f0 = (vector<double,std::allocator<double>> *)uVar27;
      if (local_12c < local_10c) {
        do {
          iVar21 = (this->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [(this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar22]];
          if ((this->ur_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar21] == 0) {
            iVar33 = (this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar21];
            local_108 = (double)(long)iVar33;
            iVar25 = (this->ur_lastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar21];
            local_138 = (ulong)iVar25;
            iVar25 = iVar25 - iVar33;
            uVar24 = (uint)((double)iVar25 * 1.1 + 5.0);
            local_118 = (vector<int,std::allocator<int>> *)(ulong)uVar24;
            iVar33 = (int)((ulong)((long)(this->ur_index).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                  (long)(this->ur_index).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 2);
            __new_size = (size_type)(int)(uVar24 + iVar33);
            std::vector<int,_std::allocator<int>_>::resize(local_c0,__new_size);
            std::vector<double,_std::allocator<double>_>::resize
                      ((vector<double,_std::allocator<double>_> *)local_c8,__new_size);
            sVar23 = local_138 * 4 + (long)local_108 * -4;
            if (sVar23 != 0) {
              piVar18 = (local_c0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              memmove(piVar18 + iVar33,piVar18 + (long)local_108,sVar23);
            }
            sVar23 = local_138 * 8 + (long)local_108 * -8;
            if (sVar23 != 0) {
              pdVar4 = (((_Vector_base<double,_std::allocator<double>_> *)&local_c8->field_0x0)->
                       _M_impl).super__Vector_impl_data._M_start;
              memmove(pdVar4 + iVar33,pdVar4 + (long)local_108,sVar23);
            }
            (this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar21] = iVar33;
            (this->ur_lastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar21] = iVar33 + iVar25;
            (this->ur_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar21] = (int)local_118 - iVar25;
          }
          piVar30 = (this->ur_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + iVar21;
          *piVar30 = *piVar30 + -1;
          piVar18 = (this->ur_lastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar33 = piVar18[iVar21];
          piVar18[iVar21] = iVar33 + 1;
          (this->ur_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar33] = local_140.first;
          (this->ur_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar33] =
               (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar22];
          lVar22 = lVar22 + 1;
        } while (lVar22 < local_10c);
      }
      pvVar29 = local_98;
      iVar5._M_current =
           (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_68,iVar5,&local_12c);
      }
      else {
        *iVar5._M_current = local_12c;
        (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      uVar19 = local_78;
      pvVar16 = local_80;
      pHVar32 = local_b8;
      iVar5._M_current =
           (this->u_last_p).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->u_last_p).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_70,iVar5,&local_10c);
      }
      else {
        *iVar5._M_current = local_10c;
        (this->u_last_p).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      dVar2 = local_128;
      piVar30 = (this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + (long)local_128;
      iVar5._M_current =
           (this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(local_88,iVar5,piVar30);
      }
      else {
        *iVar5._M_current = *piVar30;
        (this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      piVar30 = (this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + (long)dVar2;
      iVar5._M_current =
           (this->ur_lastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->ur_lastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(local_90,iVar5,piVar30);
      }
      else {
        *iVar5._M_current = *piVar30;
        (this->ur_lastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      local_5c = ((this->ur_lastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)local_128] +
                 (this->ur_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)local_128]) -
                 (this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)local_128];
      iVar5._M_current =
           (this->ur_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->ur_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)local_a0,iVar5,&local_5c);
      }
      else {
        *iVar5._M_current = local_5c;
        (this->ur_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      iVar5._M_current =
           (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      piVar18 = (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      (this->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[local_140.first] =
           (int)((ulong)((long)iVar5._M_current - (long)piVar18) >> 2);
      piVar18[(long)local_128] = -1;
      if (iVar5._M_current ==
          (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_a8,iVar5,&local_140.first);
      }
      else {
        *iVar5._M_current = local_140.first;
        (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      __args = (double *)((long)local_e0 + (long)local_f0 * 8);
      iVar6._M_current =
           (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_38,iVar6,__args);
      }
      else {
        *iVar6._M_current = *__args;
        (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      uVar27 = (long)local_f0 + 1;
    } while (uVar27 != uVar19);
  }
  operator_delete__(pvVar29);
  operator_delete__(local_b0);
  operator_delete__(local_d0);
  operator_delete__(local_e8);
  operator_delete__(pvVar16);
  operator_delete__(local_d8);
  operator_delete__(local_e0);
  if (local_58 != (pair<int,_int> *)0x0) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

void HFactor::updateCFT(HVector* aq, HVector* ep, HighsInt* iRow
                        //, HighsInt* hint
) {
  /*
   * In the major update loop, the prefix
   *
   * c(p) = current working pivot
   * p(p) = previous pivot  (0 =< pp < cp)
   */

  HighsInt num_update = 0;
  for (HVector* vec = aq; vec != 0; vec = vec->next) num_update++;

  HVector** aq_work = new HVector*[num_update];
  HVector** ep_work = new HVector*[num_update];

  for (HighsInt i = 0; i < num_update; i++) {
    aq_work[i] = aq;
    ep_work[i] = ep;
    aq = aq->next;
    ep = ep->next;
  }

  // Pivot related buffers
  HighsInt pf_np0 = pf_pivot_index.size();
  HighsInt* p_logic = new HighsInt[num_update];
  double* p_value = new double[num_update];
  double* p_alpha = new double[num_update];
  for (HighsInt cp = 0; cp < num_update; cp++) {
    HighsInt c_row = iRow[cp];
    HighsInt i_logic = u_pivot_lookup[c_row];
    p_logic[cp] = i_logic;
    p_value[cp] = u_pivot_value[i_logic];
    p_alpha[cp] = aq_work[cp]->array[c_row];
  }

  // Temporary U pointers
  HighsInt* t_start = new HighsInt[num_update + 1];
  double* t_pivot = new double[num_update];
  t_start[0] = u_index.size();

  // Logically sorted previous row_ep
  vector<pair<HighsInt, int> > sorted_pp;

  // Major update loop
  for (HighsInt cp = 0; cp < num_update; cp++) {
    // 1. Expand partial FTRAN result to buffer
    iwork.clear();
    for (HighsInt i = 0; i < aq_work[cp]->packCount; i++) {
      HighsInt index = aq_work[cp]->packIndex[i];
      double value = aq_work[cp]->packValue[i];
      iwork.push_back(index);
      dwork[index] = value;
    }

    // 2. Update partial FTRAN result by recent FT matrix
    for (HighsInt pp = 0; pp < cp; pp++) {
      HighsInt p_row = iRow[pp];
      double value = dwork[p_row];
      HighsInt pf_pp = pp + pf_np0;
      for (HighsInt i = pf_start[pf_pp]; i < pf_start[pf_pp + 1]; i++)
        value -= dwork[pf_index[i]] * pf_value[i];
      iwork.push_back(p_row);  // OK to duplicate
      dwork[p_row] = value;
    }

    // 3. Store the partial FTRAN result to matrix U
    double ppaq = dwork[iRow[cp]];  // pivot of the partial aq
    dwork[iRow[cp]] = 0;
    HighsInt u_countX = t_start[cp];
    HighsInt u_startX = u_countX;
    for (unsigned i = 0; i < iwork.size(); i++) {
      HighsInt index = iwork[i];
      double value = dwork[index];
      dwork[index] = 0;  // This effectively removes all duplication
      if (fabs(value) > kHighsTiny) {
        u_index.push_back(index);
        u_value.push_back(value);
      }
    }
    u_countX = u_index.size();
    t_start[cp + 1] = u_countX;
    t_pivot[cp] = p_value[cp] * p_alpha[cp];

    // 4. Expand partial BTRAN result to buffer
    iwork.clear();
    for (HighsInt i = 0; i < ep_work[cp]->packCount; i++) {
      HighsInt index = ep_work[cp]->packIndex[i];
      double value = ep_work[cp]->packValue[i];
      iwork.push_back(index);
      dwork[index] = value;
    }

    // 5. Delete logical later rows (in logical order)
    for (HighsInt isort = 0; isort < cp; isort++) {
      HighsInt pp = sorted_pp[isort].second;
      HighsInt p_row = iRow[pp];
      double multiplier = -p_value[pp] * dwork[p_row];
      if (fabs(dwork[p_row]) > kHighsTiny) {
        for (HighsInt i = 0; i < ep_work[pp]->packCount; i++) {
          HighsInt index = ep_work[pp]->packIndex[i];
          double value = ep_work[pp]->packValue[i];
          iwork.push_back(index);
          dwork[index] += value * multiplier;
        }
      }
      dwork[p_row] = 0;  // Force to be 0
    }

    // 6. Update partial BTRAN result by recent U columns
    for (HighsInt pp = 0; pp < cp; pp++) {
      HighsInt kpivot = iRow[pp];
      double value = dwork[kpivot];
      for (HighsInt k = t_start[pp]; k < t_start[pp + 1]; k++)
        value -= dwork[u_index[k]] * u_value[k];
      value /= t_pivot[pp];
      iwork.push_back(kpivot);
      dwork[kpivot] = value;  // Again OK to duplicate
    }

    // 6.x compute current alpha
    double thex = 0;
    for (HighsInt k = u_startX; k < u_countX; k++) {
      HighsInt index = u_index[k];
      double value = u_value[k];
      thex += dwork[index] * value;
    }
    t_pivot[cp] = ppaq + thex * p_value[cp];

    // 7. Store BTRAN result to FT elimination, update logic helper
    dwork[iRow[cp]] = 0;
    double pivot_multiplier = -p_value[cp];
    for (unsigned i = 0; i < iwork.size(); i++) {
      HighsInt index = iwork[i];
      double value = dwork[index];
      dwork[index] = 0;
      if (fabs(value) > kHighsTiny) {
        pf_index.push_back(index);
        pf_value.push_back(value * pivot_multiplier);
      }
    }
    pf_pivot_index.push_back(iRow[cp]);
    u_total_x += pf_index.size() - pf_start.back();
    pf_start.push_back(pf_index.size());

    // 8. Update the sorted ep
    sorted_pp.push_back(make_pair(p_logic[cp], cp));
    pdqsort(sorted_pp.begin(), sorted_pp.end());
  }

  // Now modify the U matrix
  for (HighsInt cp = 0; cp < num_update; cp++) {
    // 1. Delete pivotal row from U
    HighsInt cIndex = iRow[cp];
    HighsInt cLogic = p_logic[cp];
    u_total_x -= ur_lastp[cLogic] - ur_start[cLogic];
    for (HighsInt k = ur_start[cLogic]; k < ur_lastp[cLogic]; k++) {
      // Find the pivotal position
      HighsInt i_logic = u_pivot_lookup[ur_index[k]];
      HighsInt i_find = u_start[i_logic];
      HighsInt i_last = --u_last_p[i_logic];
      for (; i_find <= i_last; i_find++)
        if (u_index[i_find] == cIndex) break;
      // Put last to find, and delete last
      u_index[i_find] = u_index[i_last];
      u_value[i_find] = u_value[i_last];
    }

    // 2. Delete pivotal column from UR
    u_total_x -= u_last_p[cLogic] - u_start[cLogic];
    for (HighsInt k = u_start[cLogic]; k < u_last_p[cLogic]; k++) {
      // Find the pivotal position
      HighsInt i_logic = u_pivot_lookup[u_index[k]];
      HighsInt i_find = ur_start[i_logic];
      HighsInt i_last = --ur_lastp[i_logic];
      for (; i_find <= i_last; i_find++)
        if (ur_index[i_find] == cIndex) break;
      // Put last to find, and delete last
      ur_space[i_logic]++;
      ur_index[i_find] = ur_index[i_last];
      ur_value[i_find] = ur_value[i_last];
    }

    // 3. Insert the (stored) partial FTRAN to the row matrix
    HighsInt u_startX = t_start[cp];
    HighsInt u_endX = t_start[cp + 1];
    u_total_x += u_endX - u_startX;
    // Store column as UR elements
    for (HighsInt k = u_startX; k < u_endX; k++) {
      // Which ETA file
      HighsInt i_logic = u_pivot_lookup[u_index[k]];

      // Move row to the end if necessary
      if (ur_space[i_logic] == 0) {
        // Make pointers
        HighsInt row_start = ur_start[i_logic];
        HighsInt row_count = ur_lastp[i_logic] - row_start;
        HighsInt new_start = ur_index.size();
        HighsInt new_space = row_count * 1.1 + 5;

        // Check matrix UR
        ur_index.resize(new_start + new_space);
        ur_value.resize(new_start + new_space);

        // Move elements
        HighsInt i_from = row_start;
        HighsInt i_end = row_start + row_count;
        HighsInt i_to = new_start;
        copy(&ur_index[i_from], &ur_index[i_end], &ur_index[i_to]);
        copy(&ur_value[i_from], &ur_value[i_end], &ur_value[i_to]);

        // Save new pointers
        ur_start[i_logic] = new_start;
        ur_lastp[i_logic] = new_start + row_count;
        ur_space[i_logic] = new_space - row_count;
      }

      // Put into the next available space
      ur_space[i_logic]--;
      HighsInt i_put = ur_lastp[i_logic]++;
      ur_index[i_put] = cIndex;
      ur_value[i_put] = u_value[k];
    }

    // 4. Save pointers
    u_start.push_back(u_startX);
    u_last_p.push_back(u_endX);

    ur_start.push_back(ur_start[cLogic]);
    ur_lastp.push_back(ur_start[cLogic]);
    ur_space.push_back(ur_space[cLogic] + ur_lastp[cLogic] - ur_start[cLogic]);

    u_pivot_lookup[cIndex] = u_pivot_index.size();
    u_pivot_index[cLogic] = -1;
    u_pivot_index.push_back(cIndex);
    u_pivot_value.push_back(t_pivot[cp]);
  }

  //    // See if we want refactor
  //    if (u_total_x > u_merit_x && pf_pivot_index.size() > 100)
  //        *hint = 1;
  delete[] aq_work;
  delete[] ep_work;
  delete[] p_logic;
  delete[] p_value;
  delete[] p_alpha;
  delete[] t_start;
  delete[] t_pivot;
}